

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O3

int archive_write_gnutar_options(archive_write *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  archive_string_conv *paVar4;
  
  pvVar1 = a->format_data;
  iVar2 = strcmp(key,"hdrcharset");
  iVar3 = -0x14;
  if (iVar2 == 0) {
    if ((val == (char *)0x0) || (*val == '\0')) {
      archive_set_error(&a->archive,-1,"%s: hdrcharset option needs a character-set name",
                        a->format_name);
      iVar3 = -0x19;
    }
    else {
      paVar4 = archive_string_conversion_to_charset(&a->archive,val,L'\0');
      *(archive_string_conv **)((long)pvVar1 + 0x50) = paVar4;
      iVar3 = -0x1e;
      if (paVar4 != (archive_string_conv *)0x0) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
archive_write_gnutar_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct gnutar *gnutar = (struct gnutar *)a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "%s: hdrcharset option needs a character-set name",
			    a->format_name);
		else {
			gnutar->opt_sconv = archive_string_conversion_to_charset(
			    &a->archive, val, 0);
			if (gnutar->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}